

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Pain(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *ent;
  int iVar1;
  bool bVar2;
  bool local_67;
  FSoundID local_64;
  FSoundID local_60 [4];
  FString local_50;
  FString pain_sound;
  char *pcStack_40;
  FSoundID sfx_id;
  char *pain_amount;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    ent = (AActor *)(param->field_0).field_1.a;
    local_67 = true;
    if (ent != (AActor *)0x0) {
      local_67 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    }
    if (local_67 != false) {
      if ((ent->player == (player_t *)0x0) || (ent->player->morphTics != 0)) {
        iVar1 = FSoundID::operator_cast_to_int(&(ent->PainSound).super_FSoundID);
        if (iVar1 != 0) {
          FSoundID::FSoundID(&local_64,&(ent->PainSound).super_FSoundID);
          S_Sound(ent,2,&local_64,1.0,1.0);
        }
      }
      else {
        FSoundID::FSoundID((FSoundID *)((long)&pain_sound.Chars + 4));
        if (ent->health < 0x19) {
          pcStack_40 = "*pain25";
        }
        else if (ent->health < 0x32) {
          pcStack_40 = "*pain50";
        }
        else if (ent->health < 0x4b) {
          pcStack_40 = "*pain75";
        }
        else {
          pcStack_40 = "*pain100";
        }
        bVar2 = FName::operator!=(&ent->player->LastDamageType,NAME_None);
        if (bVar2) {
          FString::FString(&local_50,pcStack_40);
          FString::operator+=(&local_50,'-');
          FString::operator+=(&local_50,&ent->player->LastDamageType);
          FSoundID::operator=((FSoundID *)((long)&pain_sound.Chars + 4),&local_50);
          iVar1 = FSoundID::operator_cast_to_int((FSoundID *)((long)&pain_sound.Chars + 4));
          if (iVar1 == 0) {
            FString::operator=(&local_50,"*pain-");
            FString::operator+=(&local_50,&ent->player->LastDamageType);
            FSoundID::operator=((FSoundID *)((long)&pain_sound.Chars + 4),&local_50);
          }
          FString::~FString(&local_50);
        }
        iVar1 = FSoundID::operator_cast_to_int((FSoundID *)((long)&pain_sound.Chars + 4));
        if (iVar1 == 0) {
          FSoundID::operator=((FSoundID *)((long)&pain_sound.Chars + 4),pcStack_40);
        }
        FSoundID::FSoundID(local_60,(FSoundID *)((long)&pain_sound.Chars + 4));
        S_Sound(ent,2,local_60,1.0,1.0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Pain)
{
	PARAM_SELF_PROLOGUE(AActor);

	// [RH] Vary player pain sounds depending on health (ala Quake2)
	if (self->player && self->player->morphTics == 0)
	{
		const char *pain_amount;
		FSoundID sfx_id;

		if (self->health < 25)
			pain_amount = "*pain25";
		else if (self->health < 50)
			pain_amount = "*pain50";
		else if (self->health < 75)
			pain_amount = "*pain75";
		else
			pain_amount = "*pain100";

		// Try for damage-specific sounds first.
		if (self->player->LastDamageType != NAME_None)
		{
			FString pain_sound = pain_amount;
			pain_sound += '-';
			pain_sound += self->player->LastDamageType;
			sfx_id = pain_sound;
			if (sfx_id == 0)
			{
				// Try again without a specific pain amount.
				pain_sound = "*pain-";
				pain_sound += self->player->LastDamageType;
				sfx_id = pain_sound;
			}
		}
		if (sfx_id == 0)
		{
			sfx_id = pain_amount;
		}

		S_Sound (self, CHAN_VOICE, sfx_id, 1, ATTN_NORM);
	}
	else if (self->PainSound)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
	}
	return 0;
}